

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::testSeparateHeaderAndFooter(Test *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QStandardItem *pQVar4;
  AutoTableElement *pAVar5;
  QObject *t1;
  QArrayDataPointer<char16_t> local_b0;
  AutoTableElement autoTable;
  QStandardItemModel model;
  Report report;
  QArrayDataPointer<char16_t> local_50;
  QFile footerFile;
  QFile file;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  QString::QString((QString *)&autoTable,":/doc_header.xml");
  QFile::QFile(&file,(QString *)&autoTable);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&autoTable);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x15c);
  if (cVar2 != '\0') {
    bVar1 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x15d);
    if (cVar2 != '\0') {
      QStandardItemModel::QStandardItemModel(&model,(QObject *)0x0);
      pQVar4 = (QStandardItem *)operator_new(0x10);
      QString::QString((QString *)&autoTable,"cell1");
      QStandardItem::QStandardItem(pQVar4,(QString *)&autoTable);
      QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&autoTable);
      pQVar4 = (QStandardItem *)operator_new(0x10);
      QString::QString((QString *)&autoTable,"cell2");
      QStandardItem::QStandardItem(pQVar4,(QString *)&autoTable);
      QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&autoTable);
      KDReports::AutoTableElement::AutoTableElement(&autoTable,(QAbstractItemModel *)&model);
      pAVar5 = (AutoTableElement *)KDReports::Report::mainTable();
      KDReports::MainTable::setAutoTableElement(pAVar5);
      QString::QString((QString *)&local_b0,":/doc_footer.xml");
      QFile::QFile(&footerFile,(QString *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      bVar1 = (bool)QFile::open(&footerFile,1);
      cVar2 = QTest::qVerify(bVar1,"footerFile.open(QIODevice::ReadOnly)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0x166);
      if (cVar2 != '\0') {
        bVar1 = (bool)KDReports::Report::loadFromXML
                                ((QIODevice *)&report,(ErrorDetails *)&footerFile);
        cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&footerFile)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0x167);
        if (cVar2 != '\0') {
          iVar3 = KDReports::Report::header(&report,6);
          KDReports::Header::preparePaintingPage(iVar3);
          KDReports::Header::doc();
          KDReports::TextDocument::contentDocument();
          QTextDocument::toPlainText();
          QString::QString((QString *)&local_50,"Page 1 of 1");
          bVar1 = QTest::qCompare((QString *)&local_b0,(QString *)&local_50,
                                  "header.doc().contentDocument().toPlainText()",
                                  "QString(\"Page 1 of 1\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x16e);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
          if (bVar1) {
            KDReports::Report::mainTable();
            KDReports::MainTable::autoTableElement();
            t1 = (QObject *)KDReports::AutoTableElement::tableModel();
            bVar1 = QTest::compare_ptr_helper
                              (t1,(QObject *)&model,
                               "report.mainTable()->autoTableElement()->tableModel()","baseModel",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0x170);
            if (bVar1) {
              KDReports::Report::footer(&report,6);
              KDReports::Header::doc();
              KDReports::TextDocument::contentDocument();
              QTextDocument::toPlainText();
              QString::QString((QString *)&local_50,"footer");
              QTest::qCompare((QString *)&local_b0,(QString *)&local_50,
                              "footer.doc().contentDocument().toPlainText()","QString(\"footer\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x172);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            }
          }
        }
      }
      QFile::~QFile(&footerFile);
      KDReports::AutoTableElement::~AutoTableElement(&autoTable);
      QStandardItemModel::~QStandardItemModel(&model);
    }
  }
  QFile::~QFile(&file);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testSeparateHeaderAndFooter()
    {
        Report report;
        report.setReportMode(Report::SpreadSheet);

        QFile file(":/doc_header.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&file));

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("cell1"));
        model.setItem(0, 1, new QStandardItem("cell2"));
        AutoTableElement autoTable(&model);
        report.mainTable()->setAutoTableElement(autoTable);

        QFile footerFile(":/doc_footer.xml");
        QVERIFY(footerFile.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&footerFile));

        // report.exportToFile( "testSeparateHeaderAndFooter.pdf" ); // for debugging

        // Check that we have header, table, and footer
        Header &header = report.header();
        header.preparePaintingPage(0);
        QCOMPARE(header.doc().contentDocument().toPlainText(), QString("Page 1 of 1"));
        QAbstractItemModel *baseModel = &model;
        QCOMPARE(report.mainTable()->autoTableElement()->tableModel(), baseModel);
        Footer &footer = report.footer();
        QCOMPARE(footer.doc().contentDocument().toPlainText(), QString("footer"));
    }